

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::StencilCase::executeOps
          (StencilCase *this,Context *context,IVec4 *cell,
          vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
          *ops)

{
  deUint32 dVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float x_;
  float y_;
  Vector<float,_3> local_78;
  Vector<float,_3> local_6c;
  reference local_60;
  StencilOp *op;
  __normal_iterator<const_deqp::gles2::Functional::StencilOp_*,_std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
  local_50;
  const_iterator i;
  float y1;
  float x1;
  float y0;
  float x0;
  vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
  *ops_local;
  IVec4 *cell_local;
  Context *context_local;
  StencilCase *this_local;
  
  iVar4 = tcu::Vector<int,_4>::x(cell);
  iVar5 = (*context->_vptr_Context[2])();
  x_ = (float)iVar4 / (float)iVar5 + (float)iVar4 / (float)iVar5 + -1.0;
  iVar4 = tcu::Vector<int,_4>::y(cell);
  iVar5 = (*context->_vptr_Context[3])();
  y_ = (float)iVar4 / (float)iVar5 + (float)iVar4 / (float)iVar5 + -1.0;
  iVar4 = tcu::Vector<int,_4>::z(cell);
  iVar5 = (*context->_vptr_Context[2])();
  iVar6 = tcu::Vector<int,_4>::w(cell);
  iVar7 = (*context->_vptr_Context[3])();
  dVar1 = this->m_shaderID;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&i,0.0,0.0,0.0,1.0);
  StencilShader::setColor(&this->m_shader,context,dVar1,(Vec4 *)&i);
  local_50._M_current =
       (StencilOp *)
       std::
       vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
       ::begin(ops);
  while( true ) {
    op = (StencilOp *)
         std::
         vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
         ::end(ops);
    bVar3 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<const_deqp::gles2::Functional::StencilOp_*,_std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
                        *)&op);
    if (!bVar3) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_deqp::gles2::Functional::StencilOp_*,_std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
               ::operator*(&local_50);
    TVar2 = local_60->type;
    if (TVar2 == TYPE_CLEAR_STENCIL) {
      (*context->_vptr_Context[0x33])(context,0xc11);
      uVar8 = tcu::Vector<int,_4>::x(cell);
      uVar9 = tcu::Vector<int,_4>::y(cell);
      uVar10 = tcu::Vector<int,_4>::z(cell);
      uVar11 = tcu::Vector<int,_4>::w(cell);
      (*context->_vptr_Context[0x32])(context,(ulong)uVar8,(ulong)uVar9,(ulong)uVar10,(ulong)uVar11)
      ;
      (*context->_vptr_Context[0x2c])(context,(ulong)(uint)local_60->stencil);
      (*context->_vptr_Context[0x2d])(context,0x400);
      (*context->_vptr_Context[0x34])();
    }
    else if (TVar2 == TYPE_CLEAR_DEPTH) {
      (*context->_vptr_Context[0x33])(context,0xc11);
      uVar8 = tcu::Vector<int,_4>::x(cell);
      uVar9 = tcu::Vector<int,_4>::y(cell);
      uVar10 = tcu::Vector<int,_4>::z(cell);
      uVar11 = tcu::Vector<int,_4>::w(cell);
      (*context->_vptr_Context[0x32])(context,(ulong)uVar8,(ulong)uVar9,(ulong)uVar10,(ulong)uVar11)
      ;
      (*context->_vptr_Context[0x2b])(local_60->depth);
      (*context->_vptr_Context[0x2d])(context,0x100);
      (*context->_vptr_Context[0x34])();
    }
    else if (TVar2 == TYPE_QUAD) {
      (*context->_vptr_Context[0x33])(context,0xb71);
      (*context->_vptr_Context[0x33])(context,0xb90);
      (*context->_vptr_Context[0x39])(context,(ulong)local_60->depthTest);
      (*context->_vptr_Context[0x35])
                (context,(ulong)local_60->stencilTest,(ulong)(uint)local_60->stencil,
                 (ulong)local_60->stencilMask);
      (*context->_vptr_Context[0x36])
                (context,(ulong)local_60->sFail,(ulong)local_60->dFail,(ulong)local_60->dPass);
      dVar1 = this->m_shaderID;
      tcu::Vector<float,_3>::Vector(&local_6c,x_,y_,local_60->depth);
      tcu::Vector<float,_3>::Vector
                (&local_78,(float)iVar4 / (float)iVar5 + (float)iVar4 / (float)iVar5 + x_,
                 (float)iVar6 / (float)iVar7 + (float)iVar6 / (float)iVar7 + y_,local_60->depth);
      sglr::drawQuad(context,dVar1,&local_6c,&local_78);
      (*context->_vptr_Context[0x34])(context,0xb90);
      (*context->_vptr_Context[0x34])();
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gles2::Functional::StencilOp_*,_std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
    ::operator++(&local_50,0);
  }
  return;
}

Assistant:

void StencilCase::executeOps (sglr::Context& context, const IVec4& cell, const vector<StencilOp>& ops)
{
	// For quadOps
	float x0 = 2.0f*((float)cell.x() / (float)context.getWidth())-1.0f;
	float y0 = 2.0f*((float)cell.y() / (float)context.getHeight())-1.0f;
	float x1 = x0 + 2.0f*((float)cell.z() / (float)context.getWidth());
	float y1 = y0 + 2.0f*((float)cell.w() / (float)context.getHeight());

	m_shader.setColor(context, m_shaderID, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (vector<StencilOp>::const_iterator i = ops.begin(); i != ops.end(); i++)
	{
		const StencilOp& op = *i;

		switch (op.type)
		{
			case StencilOp::TYPE_CLEAR_DEPTH:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearDepthf(op.depth);
				context.clear(GL_DEPTH_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_CLEAR_STENCIL:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearStencil(op.stencil);
				context.clear(GL_STENCIL_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_QUAD:
				context.enable(GL_DEPTH_TEST);
				context.enable(GL_STENCIL_TEST);
				context.depthFunc(op.depthTest);
				context.stencilFunc(op.stencilTest, op.stencil, op.stencilMask);
				context.stencilOp(op.sFail, op.dFail, op.dPass);
				sglr::drawQuad(context, m_shaderID, Vec3(x0, y0, op.depth), Vec3(x1, y1, op.depth));
				context.disable(GL_STENCIL_TEST);
				context.disable(GL_DEPTH_TEST);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}